

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_max_limits(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  OBJ_INDEX_DATA *pOVar2;
  int vnum;
  OBJ_INDEX_DATA *pobj;
  char arg [4608];
  uint in_stack_ffffffffffffedd8;
  undefined4 in_stack_ffffffffffffeddc;
  int iVar3;
  char *in_stack_ffffffffffffede0;
  undefined4 in_stack_ffffffffffffede8;
  int in_stack_ffffffffffffedec;
  char *in_stack_ffffffffffffedf0;
  
  one_argument(in_stack_ffffffffffffede0,
               (char *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8));
  if ((char)in_stack_ffffffffffffede8 == '\0') {
    send_to_char(in_stack_ffffffffffffedf0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  }
  else {
    iVar3 = 0;
    bVar1 = is_number((char *)(ulong)in_stack_ffffffffffffedd8);
    if (bVar1) {
      iVar3 = atoi(&stack0xffffffffffffede8);
    }
    if (iVar3 == 0) {
      send_to_char(in_stack_ffffffffffffedf0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
    }
    else {
      pOVar2 = get_obj_index(in_stack_ffffffffffffedec);
      if (pOVar2 == (OBJ_INDEX_DATA *)0x0) {
        send_to_char(in_stack_ffffffffffffedf0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
      }
      else if (pOVar2->limtotal == 0) {
        send_to_char(in_stack_ffffffffffffedf0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
      }
      else if (pOVar2->limcount < pOVar2->limtotal) {
        pOVar2->limcount = pOVar2->limtotal;
        send_to_char(in_stack_ffffffffffffedf0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
      }
      else {
        send_to_char(in_stack_ffffffffffffedf0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
      }
    }
  }
  return;
}

Assistant:

void do_max_limits(CHAR_DATA *ch, char *argument)
{
	/*
	OBJ_DATA *obj;
	OBJ_DATA *o_next;
	int count;
	*/

	char arg[MAX_INPUT_LENGTH];
	OBJ_INDEX_DATA *pobj;
	int vnum;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Max limit on which items?\n\r", ch);
		return;
	}

	vnum = 0;

	if (is_number(arg))
		vnum = atoi(arg);

	if (vnum != 0)
	{
		pobj = get_obj_index(vnum);

		if (pobj == nullptr)
		{
			send_to_char("No object by that vnum exists.\n\r", ch);
			return;
		}

		if (pobj->limtotal == 0)
		{
			send_to_char("That item is not limited.\n\r", ch);
			return;
		}

		/*
		count = 0;
		for (obj = object_list; obj != nullptr; obj = o_next)
		{
			o_next = obj->next;
			if (obj->pIndexData->vnum == pobj->vnum)
				count++;
		}
		*/

		if (pobj->limcount >= pobj->limtotal)
		{
			send_to_char("That item is already at it's max count.\n\r", ch);
			return;
		}

		pobj->limcount = pobj->limtotal;
		send_to_char("Item is now maxxed.\n\r", ch);
		return;
	}
	else
	{
		send_to_char("You must give the vnum of the object to be maxxed.\n\r", ch);
		return;
	}
}